

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer-from-check.c
# Opt level: O1

int run_test_timer_from_check(void)

{
  int iVar1;
  undefined8 uVar2;
  code **ppcVar3;
  int64_t eval_b;
  int64_t eval_a;
  code *apcStack_50 [2];
  long lStack_40;
  code *pcStack_38;
  undefined8 uStack_28;
  code *pcStack_20;
  long local_18;
  long local_10;
  
  pcStack_20 = (code *)0x1d572a;
  uVar2 = uv_default_loop();
  pcStack_20 = (code *)0x1d5739;
  iVar1 = uv_prepare_init(uVar2,&prepare_handle);
  local_10 = (long)iVar1;
  local_18 = 0;
  if (local_10 == 0) {
    pcStack_20 = (code *)0x1d575c;
    uVar2 = uv_default_loop();
    pcStack_20 = (code *)0x1d576b;
    iVar1 = uv_check_init(uVar2,&check_handle);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001d597c;
    pcStack_20 = (code *)0x1d579c;
    iVar1 = uv_check_start(&check_handle,check_cb);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001d5989;
    pcStack_20 = (code *)0x1d57bf;
    uVar2 = uv_default_loop();
    pcStack_20 = (code *)0x1d57ce;
    iVar1 = uv_timer_init(uVar2,&timer_handle);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001d5996;
    pcStack_20 = (code *)0x1d5806;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001d59a3;
    pcStack_20 = (code *)0x1d5829;
    uVar2 = uv_default_loop();
    pcStack_20 = (code *)0x1d5833;
    iVar1 = uv_run(uVar2,0);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001d59b0;
    local_10 = 1;
    local_18 = (long)prepare_cb_called;
    if (local_18 != 1) goto LAB_001d59bd;
    local_10 = 1;
    local_18 = (long)check_cb_called;
    if (local_18 != 1) goto LAB_001d59ca;
    local_10 = 1;
    local_18 = (long)timer_cb_called;
    if (local_18 != 1) goto LAB_001d59d7;
    pcStack_20 = (code *)0x1d58c8;
    uv_close(&prepare_handle,0);
    pcStack_20 = (code *)0x1d58d6;
    uv_close(&check_handle,0);
    pcStack_20 = (code *)0x1d58e4;
    uv_close(&timer_handle,0);
    pcStack_20 = (code *)0x1d58e9;
    uVar2 = uv_default_loop();
    pcStack_20 = (code *)0x1d58f6;
    iVar1 = uv_run(uVar2,1);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001d59e4;
    pcStack_20 = (code *)0x1d5919;
    uVar2 = uv_default_loop();
    pcStack_20 = (code *)0x1d592d;
    uv_walk(uVar2,close_walk_cb,0);
    pcStack_20 = (code *)0x1d5937;
    uv_run(uVar2,0);
    local_10 = 0;
    pcStack_20 = (code *)0x1d5945;
    uVar2 = uv_default_loop();
    pcStack_20 = (code *)0x1d594d;
    iVar1 = uv_loop_close(uVar2);
    local_18 = (long)iVar1;
    if (local_10 == local_18) {
      pcStack_20 = (code *)0x1d5967;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_20 = (code *)0x1d597c;
    run_test_timer_from_check_cold_1();
LAB_001d597c:
    pcStack_20 = (code *)0x1d5989;
    run_test_timer_from_check_cold_2();
LAB_001d5989:
    pcStack_20 = (code *)0x1d5996;
    run_test_timer_from_check_cold_3();
LAB_001d5996:
    pcStack_20 = (code *)0x1d59a3;
    run_test_timer_from_check_cold_4();
LAB_001d59a3:
    pcStack_20 = (code *)0x1d59b0;
    run_test_timer_from_check_cold_5();
LAB_001d59b0:
    pcStack_20 = (code *)0x1d59bd;
    run_test_timer_from_check_cold_6();
LAB_001d59bd:
    pcStack_20 = (code *)0x1d59ca;
    run_test_timer_from_check_cold_7();
LAB_001d59ca:
    pcStack_20 = (code *)0x1d59d7;
    run_test_timer_from_check_cold_8();
LAB_001d59d7:
    pcStack_20 = (code *)0x1d59e4;
    run_test_timer_from_check_cold_9();
LAB_001d59e4:
    pcStack_20 = (code *)0x1d59f1;
    run_test_timer_from_check_cold_10();
  }
  pcStack_20 = check_cb;
  run_test_timer_from_check_cold_11();
  pcStack_38 = (code *)0x1d5a0e;
  iVar1 = uv_check_stop(&check_handle);
  pcStack_20 = (code *)(long)iVar1;
  uStack_28 = 0;
  if (pcStack_20 == (code *)0x0) {
    pcStack_38 = (code *)0x1d5a3a;
    iVar1 = uv_timer_stop(&timer_handle);
    pcStack_20 = (code *)(long)iVar1;
    uStack_28 = 0;
    if (pcStack_20 != (code *)0x0) goto LAB_001d5b4a;
    pcStack_38 = (code *)0x1d5a74;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    pcStack_20 = (code *)(long)iVar1;
    uStack_28 = 0;
    if (pcStack_20 != (code *)0x0) goto LAB_001d5b59;
    pcStack_38 = (code *)0x1d5aa7;
    iVar1 = uv_prepare_start(&prepare_handle,prepare_cb);
    pcStack_20 = (code *)(long)iVar1;
    uStack_28 = 0;
    if (pcStack_20 != (code *)0x0) goto LAB_001d5b68;
    pcStack_20 = (code *)(long)prepare_cb_called;
    uStack_28 = 0;
    if (pcStack_20 != (code *)0x0) goto LAB_001d5b77;
    pcStack_20 = (code *)(long)check_cb_called;
    uStack_28 = 0;
    if (pcStack_20 != (code *)0x0) goto LAB_001d5b86;
    pcStack_20 = (code *)(long)timer_cb_called;
    uStack_28 = 0;
    if (pcStack_20 == (code *)0x0) {
      check_cb_called = check_cb_called + 1;
      return check_cb_called;
    }
  }
  else {
    pcStack_38 = (code *)0x1d5b4a;
    check_cb_cold_1();
LAB_001d5b4a:
    pcStack_38 = (code *)0x1d5b59;
    check_cb_cold_2();
LAB_001d5b59:
    pcStack_38 = (code *)0x1d5b68;
    check_cb_cold_3();
LAB_001d5b68:
    pcStack_38 = (code *)0x1d5b77;
    check_cb_cold_4();
LAB_001d5b77:
    pcStack_38 = (code *)0x1d5b86;
    check_cb_cold_5();
LAB_001d5b86:
    pcStack_38 = (code *)0x1d5b95;
    check_cb_cold_6();
  }
  pcStack_38 = timer_cb;
  check_cb_cold_7();
  apcStack_50[0] = (code *)0x1d5bb4;
  iVar1 = uv_timer_stop(&timer_handle);
  pcStack_38 = (code *)(long)iVar1;
  lStack_40 = 0;
  if (pcStack_38 == (code *)0x0) {
    pcStack_38 = (code *)0x1;
    lStack_40 = (long)prepare_cb_called;
    if (lStack_40 != 1) goto LAB_001d5c4f;
    pcStack_38 = (code *)0x1;
    lStack_40 = (long)check_cb_called;
    if (lStack_40 != 1) goto LAB_001d5c5e;
    pcStack_38 = (code *)(long)timer_cb_called;
    lStack_40 = 0;
    if (pcStack_38 == (code *)0x0) {
      timer_cb_called = timer_cb_called + 1;
      return timer_cb_called;
    }
  }
  else {
    apcStack_50[0] = (code *)0x1d5c4f;
    timer_cb_cold_1();
LAB_001d5c4f:
    apcStack_50[0] = (code *)0x1d5c5e;
    timer_cb_cold_2();
LAB_001d5c5e:
    apcStack_50[0] = (code *)0x1d5c6d;
    timer_cb_cold_3();
  }
  apcStack_50[0] = prepare_cb;
  timer_cb_cold_4();
  iVar1 = uv_prepare_stop(&prepare_handle);
  apcStack_50[0] = (code *)(long)iVar1;
  if (apcStack_50[0] == (code *)0x0) {
    apcStack_50[0] = (code *)(long)prepare_cb_called;
    if (apcStack_50[0] != (code *)0x0) goto LAB_001d5d27;
    apcStack_50[0] = (code *)0x1;
    if (check_cb_called == 1) {
      apcStack_50[0] = (code *)(long)timer_cb_called;
      if (apcStack_50[0] == (code *)0x0) {
        prepare_cb_called = prepare_cb_called + 1;
        return prepare_cb_called;
      }
      goto LAB_001d5d45;
    }
  }
  else {
    prepare_cb_cold_1();
LAB_001d5d27:
    prepare_cb_cold_2();
  }
  prepare_cb_cold_3();
LAB_001d5d45:
  ppcVar3 = apcStack_50;
  prepare_cb_cold_4();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(ppcVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(timer_from_check) {
  ASSERT_OK(uv_prepare_init(uv_default_loop(), &prepare_handle));
  ASSERT_OK(uv_check_init(uv_default_loop(), &check_handle));
  ASSERT_OK(uv_check_start(&check_handle, check_cb));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT_OK(uv_timer_start(&timer_handle, timer_cb, 50, 0));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(1, prepare_cb_called);
  ASSERT_EQ(1, check_cb_called);
  ASSERT_EQ(1, timer_cb_called);
  uv_close((uv_handle_t*) &prepare_handle, NULL);
  uv_close((uv_handle_t*) &check_handle, NULL);
  uv_close((uv_handle_t*) &timer_handle, NULL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_ONCE));
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}